

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::setupRevolute
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *jointAxis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool disableParentCollision)

{
  int *piVar1;
  btVector3 *pbVar2;
  btQuaternion *pbVar3;
  btSpatialMotionVector *pbVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined8 uVar6;
  btMultibodyLink *pbVar8;
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  uVar5 = this->m_dofCount;
  uVar7 = this->m_posVarCnt;
  this->m_dofCount = uVar5 + 1;
  this->m_posVarCnt = uVar7 + 1;
  pbVar8 = (this->m_links).m_data;
  pbVar8[i].m_mass = mass;
  uVar6 = *(undefined8 *)(inertia->m_floats + 2);
  pbVar2 = &pbVar8[i].m_inertiaLocal;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar6;
  pbVar8 = (this->m_links).m_data;
  pbVar8[i].m_parent = parent;
  uVar6 = *(undefined8 *)((rotParentToThis->super_btQuadWord).m_floats + 2);
  pbVar3 = &pbVar8[i].m_zeroRotParentToThis;
  *(undefined8 *)(pbVar3->super_btQuadWord).m_floats =
       *(undefined8 *)(rotParentToThis->super_btQuadWord).m_floats;
  *(undefined8 *)((pbVar3->super_btQuadWord).m_floats + 2) = uVar6;
  uVar6 = *(undefined8 *)(jointAxis->m_floats + 2);
  pbVar4 = (this->m_links).m_data[i].m_axes;
  *(undefined8 *)(pbVar4->m_topVec).m_floats = *(undefined8 *)jointAxis->m_floats;
  *(undefined8 *)((pbVar4->m_topVec).m_floats + 2) = uVar6;
  fVar14 = (float)*(undefined8 *)(jointAxis->m_floats + 1);
  fVar15 = (float)((ulong)*(undefined8 *)(jointAxis->m_floats + 1) >> 0x20);
  fVar16 = (float)*(undefined8 *)(thisPivotToThisComOffset->m_floats + 1);
  fVar17 = (float)((ulong)*(undefined8 *)(thisPivotToThisComOffset->m_floats + 1) >> 0x20);
  auVar9._4_4_ = thisPivotToThisComOffset->m_floats[0] * fVar15 - jointAxis->m_floats[0] * fVar17;
  auVar9._0_4_ = fVar17 * fVar14 - fVar15 * fVar16;
  auVar9._8_4_ = jointAxis->m_floats[0] * fVar16 - thisPivotToThisComOffset->m_floats[0] * fVar14;
  auVar9._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_links).m_data[i].m_axes[0].m_bottomVec.m_floats = auVar9;
  uVar6 = *(undefined8 *)(thisPivotToThisComOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_dVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)thisPivotToThisComOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar6;
  uVar6 = *(undefined8 *)(parentComToThisPivotOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_eVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)parentComToThisPivotOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar6;
  pbVar8 = (this->m_links).m_data;
  pbVar8[i].m_jointType = eRevolute;
  pbVar8[i].m_dofCount = 1;
  pbVar8[i].m_posVarCount = 1;
  pbVar8[i].m_jointPos[0] = 0.0;
  pbVar8[i].m_jointTorque[0] = 0.0;
  if (disableParentCollision) {
    piVar1 = &pbVar8[i].m_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  btMultibodyLink::updateCacheMultiDof(pbVar8 + i,(btScalar *)0x0);
  lVar10 = (long)(this->m_links).m_size;
  if (0 < lVar10) {
    pbVar8 = (this->m_links).m_data;
    iVar12 = 0;
    iVar13 = 0;
    lVar11 = 0;
    do {
      piVar1 = (int *)((long)(pbVar8->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                      lVar11 + -8);
      *piVar1 = iVar12;
      piVar1[1] = iVar13;
      uVar6 = *(undefined8 *)
               ((long)(pbVar8->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar11 + -0x14);
      iVar12 = iVar12 + (int)uVar6;
      iVar13 = iVar13 + (int)((ulong)uVar6 >> 0x20);
      lVar11 = lVar11 + 600;
    } while (lVar10 * 600 - lVar11 != 0);
  }
  return;
}

Assistant:

void btMultiBody::setupRevolute(int i,
                              btScalar mass,
                              const btVector3 &inertia,
                              int parent,
                              const btQuaternion &rotParentToThis,
                              const btVector3 &jointAxis,
                              const btVector3 &parentComToThisPivotOffset,
                              const btVector3 &thisPivotToThisComOffset,
							  bool disableParentCollision)
{
	m_dofCount += 1;
	m_posVarCnt += 1;
	
    m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;
    m_links[i].setAxisTop(0, jointAxis);
    m_links[i].setAxisBottom(0, jointAxis.cross(thisPivotToThisComOffset));
    m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;

	m_links[i].m_jointType = btMultibodyLink::eRevolute;
	m_links[i].m_dofCount = 1;
	m_links[i].m_posVarCount = 1;	
	m_links[i].m_jointPos[0] = 0.f;
	m_links[i].m_jointTorque[0] = 0.f;

	if (disableParentCollision)
		m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;
    //
	m_links[i].updateCacheMultiDof();
	//
	updateLinksDofOffsets();
}